

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sig.c
# Opt level: O0

wchar_t sig_init(EditLine *el)

{
  el_signal_t paVar1;
  undefined1 local_a8 [8];
  sigset_t oset;
  sigset_t *nset;
  size_t i;
  EditLine *el_local;
  
  paVar1 = (el_signal_t)malloc(0x4b0);
  el->el_signal = paVar1;
  if (el->el_signal == (el_signal_t)0x0) {
    el_local._4_4_ = L'\xffffffff';
  }
  else {
    oset.__val[0xf] = (unsigned_long)&el->el_signal->sig_set;
    sigemptyset((sigset_t *)oset.__val[0xf]);
    sigaddset((sigset_t *)oset.__val[0xf],2);
    sigaddset((sigset_t *)oset.__val[0xf],0x14);
    sigaddset((sigset_t *)oset.__val[0xf],3);
    sigaddset((sigset_t *)oset.__val[0xf],1);
    sigaddset((sigset_t *)oset.__val[0xf],0xf);
    sigaddset((sigset_t *)oset.__val[0xf],0x12);
    sigaddset((sigset_t *)oset.__val[0xf],0x1c);
    sigprocmask(0,(sigset_t *)oset.__val[0xf],(sigset_t *)local_a8);
    for (nset = (sigset_t *)0x0; sighdl[(long)nset] != -1;
        nset = (sigset_t *)((long)nset->__val + 1)) {
      el->el_signal->sig_action[(long)nset].__sigaction_handler =
           (anon_union_8_2_5ad2d23e_for___sigaction_handler)0xffffffffffffffff;
      el->el_signal->sig_action[(long)nset].sa_flags = L'\0';
      sigemptyset((sigset_t *)&el->el_signal->sig_action[(long)nset].sa_mask);
    }
    sigprocmask(2,(sigset_t *)local_a8,(sigset_t *)0x0);
    el_local._4_4_ = L'\0';
  }
  return el_local._4_4_;
}

Assistant:

libedit_private int
sig_init(EditLine *el)
{
	size_t i;
	sigset_t *nset, oset;

	el->el_signal = el_malloc(sizeof(*el->el_signal));
	if (el->el_signal == NULL)
		return -1;

	nset = &el->el_signal->sig_set;
	(void) sigemptyset(nset);
#define	_DO(a) (void) sigaddset(nset, a);
	ALLSIGS
#undef	_DO
	(void) sigprocmask(SIG_BLOCK, nset, &oset);

	for (i = 0; sighdl[i] != -1; i++) {
		el->el_signal->sig_action[i].sa_handler = SIG_ERR;
		el->el_signal->sig_action[i].sa_flags = 0;
		sigemptyset(&el->el_signal->sig_action[i].sa_mask);
	}

	(void) sigprocmask(SIG_SETMASK, &oset, NULL);

	return 0;
}